

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
::~Vector_column(Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                 *this)

{
  pointer ppEVar1;
  pointer ppEVar2;
  
  ppEVar1 = (this->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar2 = (this->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1;
      ppEVar2 = ppEVar2 + 1) {
    _delete_entry(this,*ppEVar2);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->erasedValues_)._M_h);
  std::
  _Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ::~_Vector_base(&(this->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 );
  return;
}

Assistant:

inline Vector_column<Master_matrix>::~Vector_column()
{
  for (auto* entry : column_) {
    _delete_entry(entry);
  }
}